

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_unique_ptr.cpp
# Opt level: O0

int main(void)

{
  element_type *this;
  element_type *this_00;
  ostream *poVar1;
  element_type *peVar2;
  unique_ptr<int,_std::default_delete<int>_> local_98;
  undefined1 local_90 [8];
  shared_ptr<int> sptr2;
  shared_ptr<int> sptr;
  unique_ptr<int,_std::default_delete<int>_> local_68;
  unique_ptr<int,_std::default_delete<int>_> uptr;
  shared_ptr<TestB> local_50 [2];
  undefined1 local_30 [8];
  shared_ptr<TestB> ptr_b;
  shared_ptr<TestA> ptr_a;
  
  std::make_shared<TestA>();
  std::make_shared<TestB>();
  this = std::__shared_ptr_access<TestA,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                   ((__shared_ptr_access<TestA,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    &ptr_b.super___shared_ptr<TestB,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<TestB>::shared_ptr(local_50,(shared_ptr<TestB> *)local_30);
  TestA::ReferTestB(this,local_50);
  std::shared_ptr<TestB>::~shared_ptr(local_50);
  this_00 = std::__shared_ptr_access<TestB,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<TestB,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_30);
  std::shared_ptr<TestA>::shared_ptr
            ((shared_ptr<TestA> *)&uptr,
             (shared_ptr<TestA> *)
             &ptr_b.super___shared_ptr<TestB,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  TestB::ReferTestB(this_00,(shared_ptr<TestA> *)&uptr);
  std::shared_ptr<TestA>::~shared_ptr((shared_ptr<TestA> *)&uptr);
  std::make_unique<int,int>((int *)&local_68);
  std::shared_ptr<int>::shared_ptr<int,std::default_delete<int>,void>
            ((shared_ptr<int> *)
             &sptr2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount,&local_68);
  poVar1 = std::operator<<((ostream *)&std::cout,"Smart Ptr test: ");
  peVar2 = std::__shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &sptr2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*peVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  smart_ptr_factory();
  std::shared_ptr<int>::shared_ptr<int,std::default_delete<int>,void>
            ((shared_ptr<int> *)local_90,&local_98);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr(&local_98);
  poVar1 = std::operator<<((ostream *)&std::cout,"Smart Ptr test: ");
  peVar2 = std::__shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_90
                     );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*peVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)local_90);
  std::shared_ptr<int>::~shared_ptr
            ((shared_ptr<int> *)
             &sptr2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr(&local_68);
  std::shared_ptr<TestB>::~shared_ptr((shared_ptr<TestB> *)local_30);
  std::shared_ptr<TestA>::~shared_ptr
            ((shared_ptr<TestA> *)
             &ptr_b.super___shared_ptr<TestB,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return 0;
}

Assistant:

int main()
{
	std::shared_ptr<TestA> ptr_a = std::make_shared<TestA>();
	std::shared_ptr<TestB> ptr_b = std::make_shared<TestB>();
	ptr_a->ReferTestB(ptr_b);
	ptr_b->ReferTestB(ptr_a);

	// std::unique_ptr<int> uptr(new int(100));
	std::unique_ptr<int> uptr = std::make_unique<int>(100); // C++14
	std::shared_ptr<int> sptr = std::move(uptr);
	// sptr = std::move(uptr);
	std::cout << "Smart Ptr test: " << *sptr << std::endl;

	// return local unique_ptr
	std::shared_ptr<int> sptr2 = smart_ptr_factory();
	std::cout << "Smart Ptr test: " << *sptr2 << std::endl;


	return 0;
}